

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_model<char_const*>(IsoForest *model,char **in)

{
  bool bVar1;
  reference this;
  long in_RDI;
  IsoTree *node;
  iterator __end2;
  iterator __begin2;
  vector<IsoTree,_std::allocator<IsoTree>_> *__range2;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *__range1;
  size_t veclen;
  size_t data_sizets [2];
  double data_doubles [2];
  uint8_t data_en [5];
  vector<IsoTree,_std::allocator<IsoTree>_> *in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff80;
  __normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_> local_70;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_stack_ffffffffffffff98;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
  local_50 [3];
  char **in_stack_ffffffffffffffc8;
  IsoTree *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined8 local_20;
  byte local_15;
  byte local_14;
  byte local_13;
  char local_12;
  byte local_11;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_char>
              (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,(char **)0x65c4d9);
    *(uint *)(in_RDI + 0x18) = (uint)local_15;
    *(uint *)(in_RDI + 0x1c) = (uint)local_14;
    *(uint *)(in_RDI + 0x20) = (uint)local_13;
    *(bool *)(in_RDI + 0x40) = local_12 != '\0';
    *(uint *)(in_RDI + 0x24) = (uint)local_11;
    read_bytes<double>(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,(char **)0x65c543
                      );
    *(undefined8 *)(in_RDI + 0x28) = local_28;
    *(undefined8 *)(in_RDI + 0x30) = local_20;
    read_bytes<unsigned_long>
              (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,(char **)0x65c57d);
    *(char ***)(in_RDI + 0x38) = in_stack_ffffffffffffffc8;
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::resize(in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::shrink_to_fit((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     *)0x65c5ad);
    local_50[0]._M_current =
         (vector<IsoTree,_std::allocator<IsoTree>_> *)
         std::
         vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
         ::begin((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  *)in_stack_ffffffffffffff78);
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::end((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
           *)in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
             ::operator*(local_50);
      read_bytes<unsigned_long>
                (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,(char **)0x65c613);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::resize
                (this,(size_type)in_stack_ffffffffffffff98);
      in_stack_ffffffffffffff98 = this;
      std::vector<IsoTree,_std::allocator<IsoTree>_>::shrink_to_fit
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)0x65c62c);
      local_70._M_current =
           (IsoTree *)
           std::vector<IsoTree,_std::allocator<IsoTree>_>::begin(in_stack_ffffffffffffff78);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::end(in_stack_ffffffffffffff78);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
                                 *)in_stack_ffffffffffffff80,
                                (__normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
                                 *)in_stack_ffffffffffffff78), bVar1) {
        in_stack_ffffffffffffff80 =
             __gnu_cxx::
             __normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>::
             operator*(&local_70);
        deserialize_node<char_const*>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        __gnu_cxx::__normal_iterator<IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>::
        operator++(&local_70);
      }
      __gnu_cxx::
      __normal_iterator<std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
      ::operator++(local_50);
    }
  }
  return;
}

Assistant:

void deserialize_model(IsoForest &model, itype &in)
{
    if (interrupt_switch) return;

    uint8_t data_en[5];
    read_bytes<uint8_t>((void*)data_en, (size_t)5, in);
    model.new_cat_action = (NewCategAction)data_en[0];
    model.cat_split_type = (CategSplit)data_en[1];
    model.missing_action = (MissingAction)data_en[2];
    model.has_range_penalty = (bool)data_en[3];
    model.scoring_metric = (ScoringMetric)data_en[4];

    double data_doubles[2];
    read_bytes<double>((void*)data_doubles, (size_t)2, in);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t>((void*)data_sizets, (size_t)2, in);
    model.orig_sample_size = data_sizets[0];
    model.trees.resize(data_sizets[1]);
    model.trees.shrink_to_fit();

    size_t veclen;
    for (auto &tree : model.trees) {
        read_bytes<size_t>((void*)&veclen, (size_t)1, in);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node(node, in);
    }
}